

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoding.c
# Opt level: O2

exr_result_t
exr_decoding_choose_default_routines
          (exr_const_context_t ctxt,int part_index,exr_decode_pipeline_t *decode)

{
  short sVar1;
  ushort uVar2;
  ushort uVar3;
  int iVar4;
  long lVar5;
  exr_coding_channel_info_t *peVar6;
  long lVar7;
  int hassampling;
  uint uVar8;
  exr_result_t eVar9;
  uint uVar10;
  uint sametype;
  uint sameouttype;
  uint uVar11;
  uint sameoutbpc;
  uint uVar12;
  code *UNRECOVERED_JUMPTABLE_00;
  long lVar13;
  internal_exr_unpack_fn p_Var14;
  uint uVar15;
  long lVar16;
  char *pcVar17;
  ulong uVar18;
  long lVar19;
  uint uVar20;
  ulong uVar21;
  uint uVar22;
  uint uVar23;
  uint sameoutinc;
  int simplineoff;
  uint samebpc;
  int iVar24;
  int hastypechange;
  bool bVar25;
  undefined8 uVar26;
  uint local_94;
  int local_90;
  uint local_8c;
  
  if (ctxt == (exr_const_context_t)0x0) {
    return 2;
  }
  if (*ctxt == (_priv_exr_context_t)0x0) {
    if ((part_index < 0) || (*(int *)(ctxt + 0xc4) <= part_index)) {
      eVar9 = (**(code **)(ctxt + 0x48))
                        (ctxt,4,"Part index (%d) out of range",part_index,*(code **)(ctxt + 0x48));
      return eVar9;
    }
    if (decode != (exr_decode_pipeline_t *)0x0) {
      if ((decode->context != ctxt) || (decode->part_index != part_index)) {
        eVar9 = (**(code **)(ctxt + 0x48))
                          (ctxt,3,
                           "Cross-wired request for default routines from different context / part",
                           *(code **)(ctxt + 0x48));
        return eVar9;
      }
      lVar5 = *(long *)(*(long *)(ctxt + 0x1d8) + (ulong)(uint)part_index * 8);
      uVar15 = *(uint *)(lVar5 + 4) & 0xfffffffe;
      uVar10 = (uint)decode->channel_count;
      uVar21 = 0;
      uVar18 = 0;
      if (0 < decode->channel_count) {
        uVar18 = (ulong)uVar10;
      }
      sametype = 0xfffffffe;
      lVar19 = 0x28;
      local_8c = 0;
      local_90 = 0;
      sameouttype = 0xfffffffe;
      samebpc = 0;
      sameoutbpc = 0;
      hassampling = 0;
      hastypechange = 0;
      uVar12 = 0;
      local_94 = 0;
      simplineoff = 0;
      sameoutinc = 0;
      lVar16 = 0;
      do {
        if (uVar18 == uVar21) {
          if (uVar12 != sameoutbpc * uVar10) {
            uVar12 = 0xffffffff;
          }
          uVar22 = 0xffffffff;
          if (local_94 == sameoutbpc * uVar10) {
            uVar22 = local_94;
          }
          iVar4 = *(int *)(lVar5 + 0xb0);
          if ((((uVar15 != 2) && (iVar4 == 0)) && (local_90 == 0)) &&
             (((hastypechange == 0 && (0 < (int)local_8c)) && (local_8c == uVar10)))) {
            decode->read_fn = read_uncompressed_direct;
            decode->decompress_fn = (_func_exr_result_t__exr_decode_pipeline_ptr *)0x0;
            decode->unpack_and_convert_fn = (_func_exr_result_t__exr_decode_pipeline_ptr *)0x0;
            return 0;
          }
          decode->read_fn = default_read_chunk;
          if (iVar4 != 0) {
            decode->decompress_fn = default_decompress_chunk;
          }
          p_Var14 = internal_exr_match_decode
                              (decode,(uint)(uVar15 == 2),local_8c,local_90,sametype,sameouttype,
                               samebpc,sameoutbpc,hassampling,hastypechange,sameoutinc,uVar12,uVar22
                               ,simplineoff);
          decode->unpack_and_convert_fn = (_func_exr_result_t__exr_decode_pipeline_ptr *)p_Var14;
          if (p_Var14 != (internal_exr_unpack_fn)0x0) {
            return 0;
          }
          eVar9 = (**(code **)(ctxt + 0x40))(ctxt,4,"Unable to choose valid unpack routine");
          return eVar9;
        }
        peVar6 = decode->channels;
        lVar13 = lVar16;
        uVar22 = sameoutinc;
        if ((*(int *)((long)peVar6 + lVar19 + -0x20) != 0) &&
           (lVar7 = *(long *)((long)&peVar6->channel_name + lVar19), lVar7 != 0)) {
          sVar1 = *(short *)((long)peVar6 + lVar19 + -0xc);
          uVar22 = (uint)sVar1;
          if ((sVar1 != 2) && (sVar1 != 4)) {
            UNRECOVERED_JUMPTABLE_00 = *(code **)(ctxt + 0x48);
            uVar26 = *(undefined8 *)((long)peVar6 + lVar19 + -0x28);
            pcVar17 = "Invalid / unsupported output bytes per element (%d) for channel %c (%s)";
LAB_0011ed61:
            eVar9 = (*UNRECOVERED_JUMPTABLE_00)(ctxt,3,pcVar17,uVar22,uVar21 & 0xffffffff,uVar26);
            return eVar9;
          }
          uVar2 = *(ushort *)((long)peVar6 + lVar19 + -10);
          if (2 < uVar2) {
            UNRECOVERED_JUMPTABLE_00 = *(code **)(ctxt + 0x48);
            uVar26 = *(undefined8 *)((long)peVar6 + lVar19 + -0x28);
            pcVar17 = "Invalid / unsupported output data type (%d) for channel %c (%s)";
            uVar22 = (uint)uVar2;
            goto LAB_0011ed61;
          }
          uVar3 = *(ushort *)((long)peVar6 + lVar19 + -0xe);
          uVar11 = sametype;
          if (sametype != uVar3) {
            uVar11 = 0xffffffff;
          }
          bVar25 = sametype == 0xfffffffe;
          sametype = uVar11;
          if (bVar25) {
            sametype = (uint)uVar3;
          }
          uVar11 = sameouttype;
          if (sameouttype != uVar2) {
            uVar11 = 0xffffffff;
          }
          bVar25 = sameouttype == 0xfffffffe;
          sameouttype = uVar11;
          if (bVar25) {
            sameouttype = (uint)uVar2;
          }
          uVar20 = (uint)*(char *)((long)peVar6 + lVar19 + -0xf);
          uVar11 = samebpc;
          if (samebpc != uVar20) {
            uVar11 = 0xffffffff;
          }
          bVar25 = samebpc == 0;
          samebpc = uVar11;
          if (bVar25) {
            samebpc = uVar20;
          }
          uVar11 = sameoutbpc;
          if (sameoutbpc != uVar22) {
            uVar11 = 0xffffffff;
          }
          bVar25 = sameoutbpc == 0;
          sameoutbpc = uVar11;
          if (bVar25) {
            sameoutbpc = uVar22;
          }
          if ((*(int *)((long)peVar6 + lVar19 + -0x18) != 1) ||
             (*(int *)((long)peVar6 + lVar19 + -0x14) != 1)) {
            hassampling = 1;
          }
          uVar11 = *(uint *)((long)peVar6 + lVar19 + -8);
          iVar4 = *(int *)((long)peVar6 + lVar19 + -4);
          iVar24 = simplineoff;
          if (simplineoff != iVar4) {
            iVar24 = -1;
          }
          bVar25 = simplineoff == 0;
          simplineoff = iVar24;
          if (bVar25) {
            simplineoff = iVar4;
          }
          lVar13 = lVar7;
          uVar8 = uVar11;
          uVar23 = uVar11;
          if (uVar12 != 0) {
            lVar13 = (long)(int)(uVar22 * (int)uVar21);
            uVar23 = uVar12;
            if (lVar7 != lVar16 + lVar13) {
              uVar23 = 0xffffffff;
            }
            if ((int)uVar12 < 1) {
              uVar23 = uVar12;
            }
            uVar12 = local_94;
            if (lVar7 != lVar16 - lVar13) {
              uVar12 = 0xffffffff;
            }
            if (0 < (int)local_94) {
              local_94 = uVar12;
            }
            lVar13 = lVar16;
            uVar8 = local_94;
            if ((int)(uVar23 & local_94) < 0) {
              lVar13 = 0;
            }
          }
          local_94 = uVar8;
          local_8c = local_8c + 1;
          local_90 = local_90 + (uint)(uVar11 != uVar20);
          hastypechange = hastypechange + (uint)(uVar2 != uVar3);
          uVar12 = uVar23;
          uVar22 = uVar11;
          if ((sameoutinc != 0) && (uVar22 = sameoutinc, sameoutinc != uVar11)) {
            uVar22 = 0xffffffff;
          }
        }
        sameoutinc = uVar22;
        uVar21 = uVar21 + 1;
        lVar19 = lVar19 + 0x30;
        lVar16 = lVar13;
      } while( true );
    }
    UNRECOVERED_JUMPTABLE_00 = *(code **)(ctxt + 0x38);
    uVar26 = 3;
  }
  else {
    UNRECOVERED_JUMPTABLE_00 = *(code **)(ctxt + 0x38);
    uVar26 = 7;
  }
  eVar9 = (*UNRECOVERED_JUMPTABLE_00)(ctxt,uVar26);
  return eVar9;
}

Assistant:

exr_result_t
exr_decoding_choose_default_routines (
    exr_const_context_t ctxt, int part_index, exr_decode_pipeline_t* decode)
{
    int32_t isdeep = 0, chanstofill = 0, chanstounpack = 0, sametype = -2,
            sameouttype = -2, samebpc = 0, sameoutbpc = 0, hassampling = 0,
            hastypechange = 0, simpinterleave = 0, simpinterleaverev = 0,
            simplineoff = 0, sameoutinc = 0;
    uint8_t* interleaveptr = NULL;
    EXR_PROMOTE_READ_CONST_CONTEXT_AND_PART_OR_ERROR (ctxt, part_index);
    if (!decode) return pctxt->standard_error (pctxt, EXR_ERR_INVALID_ARGUMENT);

    if (decode->context != ctxt || decode->part_index != part_index)
        return pctxt->print_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Cross-wired request for default routines from different context / part");

    isdeep = (part->storage_mode == EXR_STORAGE_DEEP_SCANLINE ||
              part->storage_mode == EXR_STORAGE_DEEP_TILED)
                 ? 1
                 : 0;

    for (int c = 0; c < decode->channel_count; ++c)
    {
        exr_coding_channel_info_t* decc = (decode->channels + c);

        if (decc->height == 0 || !decc->decode_to_ptr) continue;

        /*
         * if a user specifies a bad pixel stride / line stride
         * we can't know this realistically, and they may want to
         * use 0 to cause things to collapse for testing purposes
         * so only test the values we know we use for decisions
         */
        if (decc->user_bytes_per_element != 2 &&
            decc->user_bytes_per_element != 4)
            return pctxt->print_error (
                pctxt,
                EXR_ERR_INVALID_ARGUMENT,
                "Invalid / unsupported output bytes per element (%d) for channel %c (%s)",
                (int) decc->user_bytes_per_element,
                c,
                decc->channel_name);

        if (decc->user_data_type != (uint16_t) (EXR_PIXEL_HALF) &&
            decc->user_data_type != (uint16_t) (EXR_PIXEL_FLOAT) &&
            decc->user_data_type != (uint16_t) (EXR_PIXEL_UINT))
            return pctxt->print_error (
                pctxt,
                EXR_ERR_INVALID_ARGUMENT,
                "Invalid / unsupported output data type (%d) for channel %c (%s)",
                (int) decc->user_data_type,
                c,
                decc->channel_name);

        if (sametype == -2)
            sametype = (int32_t) decc->data_type;
        else if (sametype != (int32_t) decc->data_type)
            sametype = -1;

        if (sameouttype == -2)
            sameouttype = (int32_t) decc->user_data_type;
        else if (sameouttype != (int32_t) decc->user_data_type)
            sameouttype = -1;

        if (samebpc == 0)
            samebpc = decc->bytes_per_element;
        else if (samebpc != decc->bytes_per_element)
            samebpc = -1;

        if (sameoutbpc == 0)
            sameoutbpc = decc->user_bytes_per_element;
        else if (sameoutbpc != decc->user_bytes_per_element)
            sameoutbpc = -1;

        if (decc->x_samples != 1 || decc->y_samples != 1) hassampling = 1;

        ++chanstofill;
        if (decc->user_pixel_stride != decc->bytes_per_element) ++chanstounpack;
        if (decc->user_data_type != decc->data_type) ++hastypechange;

        if (simplineoff == 0)
            simplineoff = decc->user_line_stride;
        else if (simplineoff != decc->user_line_stride)
            simplineoff = -1;

        if (simpinterleave == 0)
        {
            interleaveptr     = decc->decode_to_ptr;
            simpinterleave    = decc->user_pixel_stride;
            simpinterleaverev = decc->user_pixel_stride;
        }
        else
        {
            if (simpinterleave > 0 &&
                decc->decode_to_ptr !=
                    (interleaveptr + c * decc->user_bytes_per_element))
            {
                simpinterleave = -1;
            }
            if (simpinterleaverev > 0 &&
                decc->decode_to_ptr !=
                    (interleaveptr - c * decc->user_bytes_per_element))
            {
                simpinterleaverev = -1;
            }
            if (simpinterleave < 0 && simpinterleaverev < 0)
                interleaveptr = NULL;
        }

        if (sameoutinc == 0)
            sameoutinc = decc->user_pixel_stride;
        else if (sameoutinc != decc->user_pixel_stride)
            sameoutinc = -1;
    }

    if (simpinterleave != sameoutbpc * decode->channel_count)
        simpinterleave = -1;
    if (simpinterleaverev != sameoutbpc * decode->channel_count)
        simpinterleaverev = -1;

    /* special case, uncompressed and reading planar data straight in
     * to all the channels */
    if (!isdeep && part->comp_type == EXR_COMPRESSION_NONE &&
        chanstounpack == 0 && hastypechange == 0 && chanstofill > 0 &&
        chanstofill == decode->channel_count)
    {
        decode->read_fn               = &read_uncompressed_direct;
        decode->decompress_fn         = NULL;
        decode->unpack_and_convert_fn = NULL;
        return EXR_ERR_SUCCESS;
    }
    decode->read_fn = &default_read_chunk;
    if (part->comp_type != EXR_COMPRESSION_NONE)
        decode->decompress_fn = &default_decompress_chunk;

    decode->unpack_and_convert_fn = internal_exr_match_decode (
        decode,
        isdeep,
        chanstofill,
        chanstounpack,
        sametype,
        sameouttype,
        samebpc,
        sameoutbpc,
        hassampling,
        hastypechange,
        sameoutinc,
        simpinterleave,
        simpinterleaverev,
        simplineoff);

    if (!decode->unpack_and_convert_fn)
        return pctxt->report_error (
            pctxt,
            EXR_ERR_ARGUMENT_OUT_OF_RANGE,
            "Unable to choose valid unpack routine");

    return EXR_ERR_SUCCESS;
}